

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cc
# Opt level: O0

string * onmt::int_to_hex_abi_cxx11_(int i,int width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *this;
  int in_EDX;
  int in_ESI;
  string *in_RDI;
  stringstream stream;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_198);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_188,_Var1._M_c);
  _Var2 = std::setw(local_10);
  poVar3 = std::operator<<(poVar3,_Var2);
  this = (void *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(this,local_c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string int_to_hex(int i, int width)
  {
    std::stringstream stream;
    stream << std::setfill('0') << std::setw(width) << std::hex << i;
    return stream.str();
  }